

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int cvQuadAllocVectors(CVodeMem cv_mem,N_Vector tmpl)

{
  undefined8 uVar1;
  undefined8 in_RSI;
  long in_RDI;
  int j;
  int i;
  int local_20;
  int local_1c;
  int local_4;
  
  uVar1 = N_VClone(in_RSI);
  *(undefined8 *)(in_RDI + 0x268) = uVar1;
  if (*(long *)(in_RDI + 0x268) == 0) {
    local_4 = 0;
  }
  else {
    uVar1 = N_VClone(in_RSI);
    *(undefined8 *)(in_RDI + 0x278) = uVar1;
    if (*(long *)(in_RDI + 0x278) == 0) {
      N_VDestroy(*(undefined8 *)(in_RDI + 0x268));
      local_4 = 0;
    }
    else {
      uVar1 = N_VClone(in_RSI);
      *(undefined8 *)(in_RDI + 0x270) = uVar1;
      if (*(long *)(in_RDI + 0x270) == 0) {
        N_VDestroy(*(undefined8 *)(in_RDI + 0x268));
        N_VDestroy(*(undefined8 *)(in_RDI + 0x278));
        local_4 = 0;
      }
      else {
        uVar1 = N_VClone(in_RSI);
        *(undefined8 *)(in_RDI + 0x280) = uVar1;
        if (*(long *)(in_RDI + 0x280) == 0) {
          N_VDestroy(*(undefined8 *)(in_RDI + 0x268));
          N_VDestroy(*(undefined8 *)(in_RDI + 0x278));
          N_VDestroy(*(undefined8 *)(in_RDI + 0x270));
          local_4 = 0;
        }
        else {
          for (local_20 = 0; local_20 <= *(int *)(in_RDI + 0x598); local_20 = local_20 + 1) {
            uVar1 = N_VClone(in_RSI);
            *(undefined8 *)(in_RDI + 0x200 + (long)local_20 * 8) = uVar1;
            if (*(long *)(in_RDI + 0x200 + (long)local_20 * 8) == 0) {
              N_VDestroy(*(undefined8 *)(in_RDI + 0x268));
              N_VDestroy(*(undefined8 *)(in_RDI + 0x278));
              N_VDestroy(*(undefined8 *)(in_RDI + 0x270));
              N_VDestroy(*(undefined8 *)(in_RDI + 0x280));
              for (local_1c = 0; local_1c < local_20; local_1c = local_1c + 1) {
                N_VDestroy(*(undefined8 *)(in_RDI + 0x200 + (long)local_1c * 8));
              }
              return 0;
            }
          }
          *(undefined4 *)(in_RDI + 0x834) = *(undefined4 *)(in_RDI + 0x598);
          *(long *)(in_RDI + 0x718) =
               (long)(*(int *)(in_RDI + 0x598) + 5) * *(long *)(in_RDI + 0x708) +
               *(long *)(in_RDI + 0x718);
          *(long *)(in_RDI + 0x720) =
               (long)(*(int *)(in_RDI + 0x598) + 5) * *(long *)(in_RDI + 0x710) +
               *(long *)(in_RDI + 0x720);
          local_4 = 1;
        }
      }
    }
  }
  return local_4;
}

Assistant:

static sunbooleantype cvQuadAllocVectors(CVodeMem cv_mem, N_Vector tmpl)
{
  int i, j;

  /* Allocate ewtQ */
  cv_mem->cv_ewtQ = N_VClone(tmpl);
  if (cv_mem->cv_ewtQ == NULL) { return (SUNFALSE); }

  /* Allocate acorQ */
  cv_mem->cv_acorQ = N_VClone(tmpl);
  if (cv_mem->cv_acorQ == NULL)
  {
    N_VDestroy(cv_mem->cv_ewtQ);
    return (SUNFALSE);
  }

  /* Allocate yQ */
  cv_mem->cv_yQ = N_VClone(tmpl);
  if (cv_mem->cv_yQ == NULL)
  {
    N_VDestroy(cv_mem->cv_ewtQ);
    N_VDestroy(cv_mem->cv_acorQ);
    return (SUNFALSE);
  }

  /* Allocate tempvQ */
  cv_mem->cv_tempvQ = N_VClone(tmpl);
  if (cv_mem->cv_tempvQ == NULL)
  {
    N_VDestroy(cv_mem->cv_ewtQ);
    N_VDestroy(cv_mem->cv_acorQ);
    N_VDestroy(cv_mem->cv_yQ);
    return (SUNFALSE);
  }

  /* Allocate zQn[0] ... zQn[maxord] */

  for (j = 0; j <= cv_mem->cv_qmax; j++)
  {
    cv_mem->cv_znQ[j] = N_VClone(tmpl);
    if (cv_mem->cv_znQ[j] == NULL)
    {
      N_VDestroy(cv_mem->cv_ewtQ);
      N_VDestroy(cv_mem->cv_acorQ);
      N_VDestroy(cv_mem->cv_yQ);
      N_VDestroy(cv_mem->cv_tempvQ);
      for (i = 0; i < j; i++) { N_VDestroy(cv_mem->cv_znQ[i]); }
      return (SUNFALSE);
    }
  }

  /* Store the value of qmax used here */
  cv_mem->cv_qmax_allocQ = cv_mem->cv_qmax;

  /* Update solver workspace lengths */
  cv_mem->cv_lrw += (cv_mem->cv_qmax + 5) * cv_mem->cv_lrw1Q;
  cv_mem->cv_liw += (cv_mem->cv_qmax + 5) * cv_mem->cv_liw1Q;

  return (SUNTRUE);
}